

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SafetyCheckSickOrOk(sqlite3 *db)

{
  u8 uVar1;
  u8 eOpenState;
  sqlite3 *db_local;
  
  uVar1 = db->eOpenState;
  if (((uVar1 == 0xba) || (uVar1 == 'v')) || (uVar1 == 'm')) {
    db_local._4_4_ = 1;
  }
  else {
    logBadConnection("invalid");
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckSickOrOk(sqlite3 *db){
  u8 eOpenState;
  eOpenState = db->eOpenState;
  if( eOpenState!=SQLITE_STATE_SICK &&
      eOpenState!=SQLITE_STATE_OPEN &&
      eOpenState!=SQLITE_STATE_BUSY ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    logBadConnection("invalid");
    return 0;
  }else{
    return 1;
  }
}